

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestNative.cpp
# Opt level: O0

Variant * MemberFunction(Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  int value;
  element_type *peVar1;
  TestClass *this;
  any local_38;
  TestClass *local_28;
  TestClass *testClass;
  Parameters *params_local;
  ScriptPtr *script_local;
  
  testClass = (TestClass *)params;
  params_local = (Parameters *)script;
  script_local = (ScriptPtr *)__return_storage_ptr__;
  peVar1 = std::__shared_ptr_access<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)script);
  (*peVar1->_vptr_IScript[8])();
  this = std::any_cast<TestClass*>(&local_38);
  std::any::~any(&local_38);
  local_28 = this;
  value = TestClass::GetTestValue(this);
  Jinx::Variant::Variant(__return_storage_ptr__,value);
  return __return_storage_ptr__;
}

Assistant:

static Variant MemberFunction(ScriptPtr script, Parameters params)
{
	TestClass * testClass = JinxAnyCast<TestClass *>(script->GetUserContext());
	return testClass->GetTestValue();
}